

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ExprNodePtr __thiscall punky::par::Parser::parse_call_expression(Parser *this,ExprNodePtr *function)

{
  ExprNode *pEVar1;
  pointer pcVar2;
  optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>_>
  *in_RDX;
  bool bVar3;
  OptCallArgs arguments;
  Token call_tok;
  pointer local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [24];
  long local_38 [3];
  
  local_50._0_4_ =
       *(undefined4 *)
        &function[6]._M_t.
         super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>.
         _M_t.
         super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
         super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl;
  local_38[2]._0_1_ = 0;
  bVar3 = *(char *)&function[0xb]._M_t.
                    super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
                    .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl == '\x01';
  if (bVar3) {
    local_50._8_8_ = local_38;
    pEVar1 = function[7]._M_t.
             super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
             .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_50 + 8),pEVar1,
               (long)&((function[8]._M_t.
                        super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>
                        .super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl)->
                      super_AstNode)._vptr_AstNode + (long)&(pEVar1->super_AstNode)._vptr_AstNode);
  }
  local_38[2]._0_1_ = bVar3;
  parse_call_arguments((Parser *)local_60);
  std::
  make_unique<punky::ast::CallExpression,punky::tok::Token&,std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::optional<std::unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::allocator<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>>>,std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::allocator<std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>>>>>>>
            ((Token *)&local_68,
             (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
             local_50,in_RDX);
  pcVar2 = local_68;
  local_68 = (pointer)0x0;
  (this->m_lex).m_line._M_dataplus._M_p = pcVar2;
  if (local_60[8] == '\x01') {
    local_60[8] = '\0';
    std::
    unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>,_std::allocator<std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>_>_>_>_>
                   *)local_60);
  }
  if ((undefined1)local_38[2] == '\x01') {
    local_38[2]._0_1_ = 0;
    if ((long *)local_50._8_8_ != local_38) {
      operator_delete((void *)local_50._8_8_,local_38[0] + 1);
    }
  }
  return (__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
          )(__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
            )this;
}

Assistant:

auto Parser::parse_call_expression(ast::ExprNodePtr function) -> ast::ExprNodePtr
{
    auto call_tok  = m_curr_tok;
    auto arguments = parse_call_arguments();
    return std::make_unique<ast::CallExpression>(call_tok,
                                                 std::move(function), std::move(arguments));
}